

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::logObj
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this)

{
  Data *pDVar1;
  ostream *poVar2;
  rep rVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  stringstream stream;
  ofstream file;
  
  levinkov::Timer::stop(&this->data_->timer);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  poVar2 = std::ostream::_M_insert<double>((this->data_->timer).m_seconds);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"inf");
  std::operator<<(poVar2," ");
  poVar2 = std::ostream::_M_insert<double>(this->objective_);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"nan");
  poVar2 = std::operator<<(poVar2," 0 0 0");
  poVar2 = std::operator<<(poVar2," 0 0 0");
  std::operator<<(poVar2," 0 0\n");
  std::operator+(&local_3b0,&this->data_->solutionName,"-optimization-log.txt");
  std::ofstream::ofstream(&file,(string *)&local_3b0,_S_out|_S_app);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&file,(string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  pDVar1 = this->data_;
  rVar3 = std::chrono::_V2::system_clock::now();
  (pDVar1->timer).m_timeObject.__d.__r = rVar3;
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

inline void logObj()
    {
        data_.timer.stop();

        std::stringstream stream;
        stream << data_.timer.get_elapsed_seconds() << " "
               << "inf" // bound
               << " " << objective_ << " "
               << "nan"    // gap
               << " 0 0 0" // violated constraints;
               << " 0 0 0" // termination/birth/bifuraction constr.
               << " 0 0\n";

        {
            std::ofstream file(data_.solutionName + "-optimization-log.txt",
                               std::ofstream::out | std::ofstream::app);
            file << stream.str();
            file.close();
        }

        data_.timer.start();
    }